

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O3

void __thiscall CLI::Option::_reduce_results(Option *this,results_t *res,results_t *original)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  type_conflict tVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ArgumentMismatch *pAVar9;
  string *delim;
  pointer pbVar10;
  int iVar11;
  pointer pbVar12;
  undefined8 uVar13;
  _Alloc_hider p;
  int t;
  string local_b0;
  undefined1 local_90 [17];
  undefined1 uStack_7f;
  undefined6 uStack_7e;
  string local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(res,(res->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  switch((this->super_OptionBase<CLI::Option>).multi_option_policy_) {
  case TakeLast:
    local_b0._M_dataplus._M_p._0_4_ = this->type_size_max_;
    tVar5 = detail::checked_multiply<int>((int *)&local_b0,this->expected_max_);
    uVar8 = 1;
    if (1 < (int)local_b0._M_dataplus._M_p) {
      uVar8 = (ulong)local_b0._M_dataplus._M_p & 0xffffffff;
    }
    uVar7 = 0x20000000;
    if (tVar5) {
      uVar7 = uVar8;
    }
    pbVar10 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pbVar10 -
                (long)(original->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar7)
    goto switchD_0014ec91_caseD_4;
    pbVar12 = pbVar10 + -uVar7;
    break;
  case TakeFirst:
    local_b0._M_dataplus._M_p._0_4_ = this->type_size_max_;
    tVar5 = detail::checked_multiply<int>((int *)&local_b0,this->expected_max_);
    uVar8 = 1;
    if (1 < (int)local_b0._M_dataplus._M_p) {
      uVar8 = (ulong)local_b0._M_dataplus._M_p & 0xffffffff;
    }
    uVar7 = 0x20000000;
    if (tVar5) {
      uVar7 = uVar8;
    }
    pbVar12 = (original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(original->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5) <= uVar7)
    goto switchD_0014ec91_caseD_4;
    pbVar10 = pbVar12 + uVar7;
    break;
  case Join:
    if ((ulong)((long)(this->results_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->results_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21)
    goto switchD_0014ec91_caseD_4;
    bVar2 = (this->super_OptionBase<CLI::Option>).delimiter_;
    delim = (string *)&DAT_0000000a;
    if (bVar2 != 0) {
      delim = (string *)(ulong)bVar2;
    }
    local_90[0x10] = SUB81(delim,0);
    local_90._8_8_ = (pointer)0x1;
    uStack_7f = 0;
    local_90._0_8_ = (pointer)(local_90 + 0x10);
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_b0,(detail *)original,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_90,delim);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((pointer)local_90._0_8_ == (pointer)(local_90 + 0x10)) goto switchD_0014ec91_caseD_4;
    uVar13 = CONCAT62(uStack_7e,CONCAT11(uStack_7f,local_90[0x10]));
    p._M_p = (pointer)local_90._0_8_;
    goto LAB_0014ee1a;
  case TakeAll:
    goto switchD_0014ec91_caseD_4;
  case Sum:
    detail::sum_string_vector(&local_b0,original);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,&local_b0);
    uVar13 = local_b0.field_2._M_allocated_capacity;
    p._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto switchD_0014ec91_caseD_4;
LAB_0014ee1a:
    operator_delete(p._M_p,uVar13 + 1);
    goto switchD_0014ec91_caseD_4;
  default:
    iVar11 = this->expected_min_ * this->type_size_min_;
    local_b0._M_dataplus._M_p._0_4_ = this->type_size_max_;
    tVar5 = detail::checked_multiply<int>((int *)&local_b0,this->expected_max_);
    iVar11 = iVar11 + (uint)(iVar11 == 0);
    iVar6 = 0x20000000;
    if (tVar5) {
      iVar6 = (int)local_b0._M_dataplus._M_p + (uint)((int)local_b0._M_dataplus._M_p == 0);
    }
    uVar8 = (long)(original->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(original->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar8 < (ulong)(long)iVar11) {
      pAVar9 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      get_name_abi_cxx11_(&local_50,this,false,false);
      ArgumentMismatch::AtLeast
                (pAVar9,&local_50,iVar11,
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5);
      __cxa_throw(pAVar9,&ArgumentMismatch::typeinfo,Error::~Error);
    }
    if ((ulong)(long)iVar6 < uVar8) {
      pAVar9 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      get_name_abi_cxx11_(&local_70,this,false,false);
      ArgumentMismatch::AtMost
                (pAVar9,&local_70,iVar6,
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(original->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5);
      __cxa_throw(pAVar9,&ArgumentMismatch::typeinfo,Error::~Error);
    }
    goto switchD_0014ec91_caseD_4;
  }
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,pbVar12,
             pbVar10);
switchD_0014ec91_caseD_4:
  pbVar3 = (res->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (res->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 == pbVar4) {
    pbVar3 = (original->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(original->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 != 0x20) {
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (pbVar3,"{}");
    if (iVar6 != 0) {
      return;
    }
    if (this->expected_min_ * this->type_size_min_ < 1) {
      return;
    }
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"{}","");
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"%%","");
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,&local_b0);
  }
  else {
    if ((long)pbVar4 - (long)pbVar3 != 0x20) {
      return;
    }
    iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (pbVar3,"{}");
    if (iVar6 != 0) {
      return;
    }
    if (this->expected_min_ * this->type_size_min_ < 1) {
      return;
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"%%","");
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)res,&local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void _reduce_results(results_t &res, const results_t &original) const {

        // max num items expected or length of vector, always at least 1
        // Only valid for a trimming policy

        res.clear();
        // Operation depends on the policy setting
        switch(multi_option_policy_) {
        case MultiOptionPolicy::TakeAll:
            break;
        case MultiOptionPolicy::TakeLast: {
            // Allow multi-option sizes (including 0)
            std::size_t trim_size = std::min<std::size_t>(
                static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
            if(original.size() != trim_size) {
                res.assign(original.end() - static_cast<results_t::difference_type>(trim_size), original.end());
            }
        } break;
        case MultiOptionPolicy::TakeFirst: {
            std::size_t trim_size = std::min<std::size_t>(
                static_cast<std::size_t>(std::max<int>(get_items_expected_max(), 1)), original.size());
            if(original.size() != trim_size) {
                res.assign(original.begin(), original.begin() + static_cast<results_t::difference_type>(trim_size));
            }
        } break;
        case MultiOptionPolicy::Join:
            if(results_.size() > 1) {
                res.push_back(detail::join(original, std::string(1, (delimiter_ == '\0') ? '\n' : delimiter_)));
            }
            break;
        case MultiOptionPolicy::Sum:
            res.push_back(detail::sum_string_vector(original));
            break;
        case MultiOptionPolicy::Throw:
        default: {
            auto num_min = static_cast<std::size_t>(get_items_expected_min());
            auto num_max = static_cast<std::size_t>(get_items_expected_max());
            if(num_min == 0) {
                num_min = 1;
            }
            if(num_max == 0) {
                num_max = 1;
            }
            if(original.size() < num_min) {
                throw ArgumentMismatch::AtLeast(get_name(), static_cast<int>(num_min), original.size());
            }
            if(original.size() > num_max) {
                throw ArgumentMismatch::AtMost(get_name(), static_cast<int>(num_max), original.size());
            }
            break;
        }
        }
        // this check is to allow an empty vector in certain circumstances but not if expected is not zero.
        // {} is the indicator for a an empty container
        if(res.empty()) {
            if(original.size() == 1 && original[0] == "{}" && get_items_expected_min() > 0) {
                res.push_back("{}");
                res.push_back("%%");
            }
        } else if(res.size() == 1 && res[0] == "{}" && get_items_expected_min() > 0) {
            res.push_back("%%");
        }
    }